

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockmanager_tests.cpp
# Opt level: O2

void blockmanager_tests::blockmanager_block_data_availability_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  pointer local_708;
  pointer local_700;
  char *local_6f8;
  char *local_6f0;
  pointer local_6e8;
  pointer local_6e0;
  char *local_6d8;
  char *local_6d0;
  pointer local_6c8;
  pointer local_6c0;
  char *local_6b8;
  char *local_6b0;
  pointer local_6a8;
  pointer local_6a0;
  char *local_698;
  char *local_690;
  pointer local_688;
  pointer local_680;
  char *local_678;
  char *local_670;
  basic_wrap_stringstream<char> local_668;
  blockmanager_block_data_availability t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_670 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"blockmanager_block_data_availability");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_688 = (pbVar3->_M_dataplus)._M_p;
  local_680 = local_688 + pbVar3->_M_string_length;
  file.m_end = (iterator)0x61;
  file.m_begin = (iterator)&local_678;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_688,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  blockmanager_block_data_availability::blockmanager_block_data_availability(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_690 = "";
  memset(&local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_668);
  std::operator<<((ostream *)&local_668,'\"');
  std::operator<<((ostream *)&local_668,"blockmanager_block_data_availability");
  std::operator<<((ostream *)&local_668,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_668);
  local_6a8 = (pbVar3->_M_dataplus)._M_p;
  local_6a0 = local_6a8 + pbVar3->_M_string_length;
  file_00.m_end = (iterator)0x61;
  file_00.m_begin = (iterator)&local_698;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_6a8,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_668);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_6b0 = "";
  memset(&local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_668);
  std::operator<<((ostream *)&local_668,'\"');
  std::operator<<((ostream *)&local_668,"blockmanager_block_data_availability");
  std::operator<<((ostream *)&local_668,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_668);
  local_6c8 = (pbVar3->_M_dataplus)._M_p;
  local_6c0 = local_6c8 + pbVar3->_M_string_length;
  file_01.m_end = (iterator)0x61;
  file_01.m_begin = (iterator)&local_6b8;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_6c8,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_668);
  blockmanager_block_data_availability::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_6d0 = "";
  memset(&local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_668);
  std::operator<<((ostream *)&local_668,'\"');
  std::operator<<((ostream *)&local_668,"blockmanager_block_data_availability");
  std::operator<<((ostream *)&local_668,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_668);
  local_6e8 = (pbVar3->_M_dataplus)._M_p;
  local_6e0 = local_6e8 + pbVar3->_M_string_length;
  file_02.m_end = (iterator)0x61;
  file_02.m_begin = (iterator)&local_6d8;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_6e8,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_668);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_6f0 = "";
  memset(&local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_668);
  std::operator<<((ostream *)&local_668,'\"');
  std::operator<<((ostream *)&local_668,"blockmanager_block_data_availability");
  std::operator<<((ostream *)&local_668,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_668);
  local_708 = (pbVar3->_M_dataplus)._M_p;
  local_700 = local_708 + pbVar3->_M_string_length;
  file_03.m_end = (iterator)0x61;
  file_03.m_begin = (iterator)&local_6f8;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_708,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_668);
  TestChain100Setup::~TestChain100Setup(&t.super_TestChain100Setup);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(blockmanager_block_data_availability, TestChain100Setup)
{
    // The goal of the function is to return the first not pruned block in the range [upper_block, lower_block].
    LOCK(::cs_main);
    auto& chainman = m_node.chainman;
    auto& blockman = chainman->m_blockman;
    const CBlockIndex& tip = *chainman->ActiveTip();

    // Function to prune all blocks from 'last_pruned_block' down to the genesis block
    const auto& func_prune_blocks = [&](CBlockIndex* last_pruned_block)
    {
        LOCK(::cs_main);
        CBlockIndex* it = last_pruned_block;
        while (it != nullptr && it->nStatus & BLOCK_HAVE_DATA) {
            it->nStatus &= ~BLOCK_HAVE_DATA;
            it = it->pprev;
        }
    };

    // 1) Return genesis block when all blocks are available
    BOOST_CHECK_EQUAL(blockman.GetFirstBlock(tip, BLOCK_HAVE_DATA), chainman->ActiveChain()[0]);
    BOOST_CHECK(blockman.CheckBlockDataAvailability(tip, *chainman->ActiveChain()[0]));

    // 2) Check lower_block when all blocks are available
    CBlockIndex* lower_block = chainman->ActiveChain()[tip.nHeight / 2];
    BOOST_CHECK(blockman.CheckBlockDataAvailability(tip, *lower_block));

    // Prune half of the blocks
    int height_to_prune = tip.nHeight / 2;
    CBlockIndex* first_available_block = chainman->ActiveChain()[height_to_prune + 1];
    CBlockIndex* last_pruned_block = first_available_block->pprev;
    func_prune_blocks(last_pruned_block);

    // 3) The last block not pruned is in-between upper-block and the genesis block
    BOOST_CHECK_EQUAL(blockman.GetFirstBlock(tip, BLOCK_HAVE_DATA), first_available_block);
    BOOST_CHECK(blockman.CheckBlockDataAvailability(tip, *first_available_block));
    BOOST_CHECK(!blockman.CheckBlockDataAvailability(tip, *last_pruned_block));
}